

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

VisitReturn __thiscall
QMakeEvaluator::visitProVariable
          (QMakeEvaluator *this,ushort tok,ProStringList *curr,ushort **tokPtr)

{
  ushort *puVar1;
  Data *pDVar2;
  bool bVar3;
  VisitReturn VVar4;
  VisitReturn VVar5;
  ProString *this_00;
  pointer pQVar6;
  qsizetype qVar7;
  ProStringList *pPVar8;
  QArrayDataPointer<ProString> *this_01;
  iterator iVar9;
  storage_type *psVar10;
  QList<ProString> *pQVar11;
  iterator iVar12;
  char16_t *pcVar13;
  char *fmt;
  char16_t *pcVar14;
  ProStringRoUser u1;
  uint sizeHint;
  long in_FS_OFFSET;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  ProString local_198;
  QArrayDataPointer<char16_t> local_168;
  QArrayDataPointer<char> local_150;
  ProString local_138;
  QArrayDataPointer<char16_t> local_100;
  QArrayDataPointer<char> local_e8;
  QRegularExpression regexp;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<ProString> local_88;
  QStringView local_68;
  QArrayDataPointer<ProString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = *tokPtr;
  *tokPtr = puVar1 + 1;
  if ((curr->super_QList<ProString>).d.size != 1) {
    skipExpression(this,tokPtr);
    psVar10 = (storage_type *)
              QByteArrayView::lengthHelperCharArray
                        ("Left hand side of assignment must expand to exactly one word.",0x3e);
    QVar18.m_data = psVar10;
    QVar18.m_size = (qsizetype)&local_138;
    QString::fromLatin1(QVar18);
    evalError(this,&local_138.m_string);
    goto LAB_001f71b9;
  }
  sizeHint = (uint)*puVar1;
  this_00 = &map(this,(ProKey *)(curr->super_QList<ProString>).d.ptr)->super_ProString;
  if (tok != 6) {
    local_138.m_string.d.d = (Data *)0x0;
    local_138.m_string.d.ptr = (char16_t *)0x0;
    local_138.m_string.d.size = 0;
    VVar5 = expandVariableReferences(this,tokPtr,sizeHint,(ProStringList *)&local_138,false);
    if (VVar5 != ReturnError) {
      if (tok == 3) {
        ProStringList::removeEmpty((ProStringList *)&local_138);
        pQVar11 = &valuesRef(this,(ProKey *)this_00)->super_QList<ProString>;
        QList<ProString>::append(pQVar11,(QList<ProString> *)&local_138);
        if (this->m_debugLevel != 0) {
          fmt = "appending";
          goto LAB_001f74a2;
        }
      }
      else if (tok == 4) {
        pPVar8 = valuesRef(this,(ProKey *)this_00);
        ProStringList::insertUnique(pPVar8,(ProStringList *)&local_138);
        if (this->m_debugLevel != 0) {
          fmt = "appending unique";
          goto LAB_001f74a2;
        }
      }
      else if (tok == 5) {
        pPVar8 = valuesRef(this,(ProKey *)this_00);
        ProStringList::removeEach(pPVar8,(ProStringList *)&local_138);
        if (this->m_debugLevel != 0) {
          fmt = "removing";
LAB_001f74a2:
          debugMsgInternal(this,2,fmt);
        }
      }
      else {
        ProStringList::removeEmpty((ProStringList *)&local_138);
        this_01 = (QArrayDataPointer<ProString> *)
                  QMap<ProKey,_ProStringList>::operator[]
                            ((QMap<ProKey,_ProStringList> *)
                             ((this->m_valuemapStack).
                              super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                              .
                              super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                              ._M_impl._M_node.super__List_node_base._M_prev + 1),(ProKey *)this_00)
        ;
        QArrayDataPointer<ProString>::operator=(this_01,(QArrayDataPointer<ProString> *)&local_138);
        if (this->m_debugLevel != 0) {
          fmt = "assigning";
          goto LAB_001f74a2;
        }
      }
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_138);
      goto LAB_001f74bc;
    }
    VVar5 = ReturnError;
LAB_001f7221:
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_138);
    goto LAB_001f71c1;
  }
  local_58._0_16_ = ZEXT816(0);
  local_58.size = 0;
  VVar5 = ReturnTrue;
  VVar4 = expandVariableReferences(this,tokPtr,sizeHint,(ProStringList *)&local_58,true);
  if (VVar4 == ReturnError) {
    VVar5 = ReturnError;
LAB_001f73e6:
    bVar15 = false;
  }
  else {
    local_138.m_string.d.ptr = ((local_58.ptr)->m_string).d.ptr;
    local_138.m_string.d.d = (Data *)((local_58.ptr)->m_string).d.size;
    local_68 = QStringView::mid((QStringView *)&local_138,(long)(local_58.ptr)->m_offset,
                                (long)(local_58.ptr)->m_length);
    if ((local_68.m_size < 4) || (*local_68.m_data != L's')) {
      psVar10 = (storage_type *)
                QByteArrayView::lengthHelperCharArray
                          ("The ~= operator can handle only the s/// function.",0x33);
      QVar19.m_data = psVar10;
      QVar19.m_size = (qsizetype)&local_138;
      QString::fromLatin1(QVar19);
      evalError(this,&local_138.m_string);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_138);
      goto LAB_001f73e6;
    }
    local_88.size = -0x5555555555555556;
    local_88.d._0_4_ = 0xaaaaaaaa;
    local_88.d._4_4_ = 0xaaaaaaaa;
    local_88.ptr._0_4_ = 0xaaaaaaaa;
    local_88.ptr._4_4_ = 0xaaaaaaaa;
    bVar3 = true;
    QStringView::split(&local_88,&local_68,local_68.m_data[1],0,1);
    bVar15 = local_88.size - 3U < 2;
    if (bVar15) {
      if (local_88.size == 4) {
        pQVar6 = QList<QStringView>::data((QList<QStringView> *)&local_88);
        qVar7 = QStringView::indexOf(pQVar6 + 3,(QChar)0x67,0,CaseSensitive);
        bVar16 = qVar7 != -1;
        pQVar6 = QList<QStringView>::data((QList<QStringView> *)&local_88);
        qVar7 = QStringView::indexOf(pQVar6 + 3,(QChar)0x69,0,CaseSensitive);
        bVar3 = qVar7 != -1;
        pQVar6 = QList<QStringView>::data((QList<QStringView> *)&local_88);
        qVar7 = QStringView::indexOf(pQVar6 + 3,(QChar)0x71,0,CaseSensitive);
        bVar17 = qVar7 != -1;
      }
      else {
        bVar16 = false;
        bVar17 = false;
      }
      local_a8.size = -0x5555555555555556;
      local_a8.ptr = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
      local_a8.d = (Data *)0xaaaaaaaaaaaaaaaa;
      pQVar6 = QList<QStringView>::data((QList<QStringView> *)&local_88);
      QStringView::toString((QString *)&local_a8,pQVar6 + 1);
      local_c8.size = -0x5555555555555556;
      local_c8.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_c8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      pQVar6 = QList<QStringView>::data((QList<QStringView> *)&local_88);
      QStringView::toString((QString *)&local_c8,pQVar6 + 2);
      if (bVar17) {
        QRegularExpression::escape(&local_138.m_string,(QString *)&local_a8);
        qVar7 = local_a8.size;
        pDVar2 = local_a8.d;
        pcVar14 = local_a8.ptr;
        local_a8.ptr = local_138.m_string.d.ptr;
        local_a8.d = local_138.m_string.d.d;
        local_138.m_string.d.d = pDVar2;
        local_138.m_string.d.ptr = pcVar14;
        local_a8.size = local_138.m_string.d.size;
        local_138.m_string.d.size = qVar7;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_138);
      }
      _regexp = 0xaaaaaaaaaaaaaaaa;
      QRegularExpression::QRegularExpression(&regexp,(QStringView *)&local_a8,bVar3);
      pQVar11 = &valuesRef(this,(ProKey *)this_00)->super_QList<ProString>;
      iVar9 = QList<ProString>::begin(pQVar11);
      while (iVar12 = QList<ProString>::end(pQVar11), iVar9.i != iVar12.i) {
        ProString::toQString(iVar9.i,&this->m_tmp2);
        local_138.m_string.d.d = (this->m_tmp2).d.d;
        local_198.m_string.d.ptr = (this->m_tmp2).d.ptr;
        local_198.m_string.d.size = (this->m_tmp2).d.size;
        if (local_138.m_string.d.d == (Data *)0x0) {
          local_198.m_string.d.d = (Data *)0x0;
        }
        else {
          LOCK();
          ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + 1;
          UNLOCK();
          local_198.m_string.d.d = local_138.m_string.d.d;
        }
        if (local_198.m_string.d.d != (Data *)0x0) {
          LOCK();
          ((local_198.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_198.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + 1;
          UNLOCK();
        }
        local_138.m_string.d.ptr = local_198.m_string.d.ptr;
        local_138.m_string.d.size = local_198.m_string.d.size;
        QString::replace((QRegularExpression *)&local_138,(QString *)&regexp);
        if (((local_138.m_string.d.d == (Data *)0x0) ||
            (local_138.m_string.d.d != local_198.m_string.d.d)) &&
           (bVar3 = operator!=(&local_138.m_string,&local_198.m_string), bVar3)) {
          if (local_138.m_string.d.size == 0) {
            iVar9 = QList<ProString>::erase(pQVar11,iVar9.i);
          }
          else {
            ProString::setValue(iVar9.i,&local_138.m_string);
            iVar9.i = iVar9.i + 1;
          }
          if (!bVar16) {
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_198);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_138);
            break;
          }
        }
        else {
          iVar9.i = iVar9.i + 1;
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_198);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_138);
      }
      if (this->m_debugLevel != 0) {
        ProString::ProString(&local_138,(QString *)&local_a8);
        formatValue((QString *)&local_100,&local_138,true);
        QString::toLocal8Bit((QByteArray *)&local_e8,(QString *)&local_100);
        if (local_e8.ptr == (char *)0x0) {
          local_e8.ptr = (char *)&QByteArray::_empty;
        }
        ProString::ProString(&local_198,(QString *)&local_c8);
        formatValue((QString *)&local_168,&local_198,true);
        QString::toLocal8Bit((QByteArray *)&local_150,(QString *)&local_168);
        if (local_150.ptr == (char *)0x0) {
          local_150.ptr = (char *)&QByteArray::_empty;
        }
        debugMsgInternal(this,2,"replaced %s with %s",local_e8.ptr,local_150.ptr);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_150);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_198);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_100);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_138);
      }
      QRegularExpression::~QRegularExpression(&regexp);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    }
    else {
      psVar10 = (storage_type *)
                QByteArrayView::lengthHelperCharArray
                          ("The s/// function expects 3 or 4 arguments.",0x2c);
      QVar20.m_data = psVar10;
      QVar20.m_size = (qsizetype)&local_138;
      QString::fromLatin1(QVar20);
      evalError(this,&local_138.m_string);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_138);
    }
    QArrayDataPointer<QStringView>::~QArrayDataPointer((QArrayDataPointer<QStringView> *)&local_88);
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
  if (!bVar15) goto LAB_001f71c1;
LAB_001f74bc:
  VVar5 = ReturnTrue;
  if (this->m_debugLevel != 0) {
    local_138.m_string.d.ptr = (this_00->m_string).d.ptr;
    local_138.m_string.d.d = (Data *)(this_00->m_string).d.size;
    local_a8._0_16_ =
         QStringView::mid((QStringView *)&local_138,(long)this_00->m_offset,(long)this_00->m_length)
    ;
    QStringView::toLocal8Bit((QByteArray *)&local_138,(QStringView *)&local_a8);
    pcVar14 = local_138.m_string.d.ptr;
    if (local_138.m_string.d.ptr == (char16_t *)0x0) {
      pcVar14 = (char16_t *)&QByteArray::_empty;
    }
    values((ProStringList *)&local_88,this,(ProKey *)this_00);
    formatValueList((QString *)&local_58,(ProStringList *)&local_88,false);
    QString::toLocal8Bit((QByteArray *)&local_198,(QString *)&local_58);
    pcVar13 = local_198.m_string.d.ptr;
    if (local_198.m_string.d.ptr == (char16_t *)0x0) {
      pcVar13 = (char16_t *)&QByteArray::_empty;
    }
    traceMsgInternal(this,"%s := %s",pcVar14,pcVar13);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_198);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_138);
  }
  bVar3 = ProString::operator==(this_00,(ProString *)(QMakeInternal::statics + 0x150));
  if (bVar3) {
    setTemplate(this);
  }
  else {
    bVar3 = ProString::operator==(this_00,(ProString *)(QMakeInternal::statics + 0x180));
    if (bVar3) {
      QExplicitlySharedDataPointer<QMakeFeatureRoots>::reset
                (&this->m_featureRoots,(QMakeFeatureRoots *)0x0);
    }
    else {
      bVar3 = ProString::operator==(this_00,(ProString *)(QMakeInternal::statics + 0x1b0));
      if (bVar3) {
        first(&local_138,this,(ProKey *)this_00);
        ProString::operator=(&this->m_dirSep,&local_138);
      }
      else {
        bVar3 = ProString::operator==(this_00,(ProString *)(QMakeInternal::statics + 0x1e0));
        if (!bVar3) {
          bVar3 = ProString::operator==(this_00,(ProString *)(QMakeInternal::statics + 0x210));
          if (!bVar3) goto LAB_001f71c1;
          values((ProStringList *)&local_138,this,(ProKey *)this_00);
          VVar5 = checkRequirements(this,(ProStringList *)&local_138);
          goto LAB_001f7221;
        }
        values((ProStringList *)&local_138,this,(ProKey *)this_00);
        qVar7 = local_138.m_string.d.size;
        QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_138)
        ;
        if (qVar7 == 0) goto LAB_001f71be;
        local_138.m_string.d.size = -0x5555555555555556;
        local_138.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_138.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        values((ProStringList *)&local_198,this,(ProKey *)this_00);
        iVar9 = QList<ProString>::begin(&local_198);
        ProString::toQString(&local_138.m_string,iVar9.i);
        QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_198)
        ;
        bVar3 = QMakeInternal::IoUtils::isAbsolutePath(&local_138.m_string);
        if (bVar3) {
          QString::operator=(&this->m_qmakespec,(QString *)&local_138);
          local_58._0_16_ = QMakeInternal::IoUtils::fileName(&this->m_qmakespec);
          QStringView::toString(&local_198.m_string,(QStringView *)&local_58);
          pDVar2 = (this->m_qmakespecName).d.d;
          pcVar14 = (this->m_qmakespecName).d.ptr;
          (this->m_qmakespecName).d.d = local_198.m_string.d.d;
          (this->m_qmakespecName).d.ptr = local_198.m_string.d.ptr;
          qVar7 = (this->m_qmakespecName).d.size;
          (this->m_qmakespecName).d.size = local_198.m_string.d.size;
          local_198.m_string.d.d = pDVar2;
          local_198.m_string.d.ptr = pcVar14;
          local_198.m_string.d.size = qVar7;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_198)
          ;
          QExplicitlySharedDataPointer<QMakeFeatureRoots>::reset
                    (&this->m_featureRoots,(QMakeFeatureRoots *)0x0);
        }
      }
LAB_001f71b9:
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_138);
    }
  }
LAB_001f71be:
  VVar5 = ReturnTrue;
LAB_001f71c1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return VVar5;
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::visitProVariable(
        ushort tok, const ProStringList &curr, const ushort *&tokPtr)
{
    int sizeHint = *tokPtr++;

    if (curr.size() != 1) {
        skipExpression(tokPtr);
        if (!m_cumulative || !curr.isEmpty())
            evalError(fL1S("Left hand side of assignment must expand to exactly one word."));
        return ReturnTrue;
    }
    const ProKey &varName = map(curr.first());

    if (tok == TokReplace) {      // ~=
        // DEFINES ~= s/a/b/?[gqi]

        ProStringList varVal;
        if (expandVariableReferences(tokPtr, sizeHint, &varVal, true) == ReturnError)
            return ReturnError;
        QStringView val = varVal.at(0).toQStringView();
        if (val.size() < 4 || val.at(0) != QLatin1Char('s')) {
            evalError(fL1S("The ~= operator can handle only the s/// function."));
            return ReturnTrue;
        }
        QChar sep = val.at(1);
        auto func = val.split(sep, Qt::KeepEmptyParts);
        if (func.size() < 3 || func.size() > 4) {
            evalError(fL1S("The s/// function expects 3 or 4 arguments."));
            return ReturnTrue;
        }

        bool global = false, quote = false, case_sense = false;
        if (func.size() == 4) {
            global = func[3].indexOf(QLatin1Char('g')) != -1;
            case_sense = func[3].indexOf(QLatin1Char('i')) == -1;
            quote = func[3].indexOf(QLatin1Char('q')) != -1;
        }
        QString pattern = func[1].toString();
        QString replace = func[2].toString();
        if (quote)
            pattern = QRegularExpression::escape(pattern);

        QRegularExpression regexp(pattern, case_sense ? QRegularExpression::NoPatternOption :
                                                        QRegularExpression::CaseInsensitiveOption);

        // We could make a union of modified and unmodified values,
        // but this will break just as much as it fixes, so leave it as is.
        replaceInList(&valuesRef(varName), regexp, replace, global, m_tmp2);
        debugMsg(2, "replaced %s with %s", dbgQStr(pattern), dbgQStr(replace));
    } else {
        ProStringList varVal;
        if (expandVariableReferences(tokPtr, sizeHint, &varVal, false) == ReturnError)
            return ReturnError;
        switch (tok) {
        default: // whatever - cannot happen
        case TokAssign:          // =
            varVal.removeEmpty();
            // FIXME: add check+warning about accidental value removal.
            // This may be a bit too noisy, though.
            m_valuemapStack.top()[varName] = varVal;
            debugMsg(2, "assigning");
            break;
        case TokAppendUnique:    // *=
            valuesRef(varName).insertUnique(varVal);
            debugMsg(2, "appending unique");
            break;
        case TokAppend:          // +=
            varVal.removeEmpty();
            valuesRef(varName) += varVal;
            debugMsg(2, "appending");
            break;
        case TokRemove:       // -=
            if (!m_cumulative) {
                valuesRef(varName).removeEach(varVal);
            } else {
                // We are stingy with our values.
            }
            debugMsg(2, "removing");
            break;
        }
    }
    traceMsg("%s := %s", dbgKey(varName), dbgStrList(values(varName)));

    if (varName == statics.strTEMPLATE)
        setTemplate();
    else if (varName == statics.strQMAKE_PLATFORM)
        m_featureRoots = nullptr;
    else if (varName == statics.strQMAKE_DIR_SEP)
        m_dirSep = first(varName);
    else if (varName == statics.strQMAKESPEC) {
        if (!values(varName).isEmpty()) {
            QString spec = values(varName).first().toQString();
            if (IoUtils::isAbsolutePath(spec)) {
                m_qmakespec = spec;
                m_qmakespecName = IoUtils::fileName(m_qmakespec).toString();
                m_featureRoots = nullptr;
            }
        }
    }
#ifdef PROEVALUATOR_FULL
    else if (varName == statics.strREQUIRES)
        return checkRequirements(values(varName));
#endif

    return ReturnTrue;
}